

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::base::CircularQueue<long>::emplace_back<long>(CircularQueue<long> *this,long *args)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->capacity_;
  uVar2 = this->end_;
  if (uVar1 <= uVar2 - this->begin_) {
    Grow(this,0);
    uVar1 = this->capacity_;
    uVar2 = this->end_;
  }
  this->end_ = uVar2 + 1;
  (this->entries_)._M_t.super___uniq_ptr_impl<long,_perfetto::base::AlignedDeleter<long>_>._M_t.
  super__Tuple_impl<0UL,_long_*,_perfetto::base::AlignedDeleter<long>_>.
  super__Head_base<0UL,_long_*,_false>._M_head_impl[uVar1 - 1 & uVar2] = *args;
  return;
}

Assistant:

void emplace_back(Args&&... args) {
    increment_generation();
    if (PERFETTO_UNLIKELY(size() >= capacity_))
      Grow();
    T* slot = Get(end_++);
    new (slot) T(std::forward<Args>(args)...);
  }